

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

bool Catch::isDebuggerActive(void)

{
  bool bVar1;
  int iVar2;
  istream *piVar3;
  ulong uVar4;
  char *pcVar5;
  bool local_261;
  int local_24c;
  string local_248 [8];
  string line;
  istream local_218 [8];
  ifstream in;
  ErrnoGuard local_10;
  bool local_9;
  ErrnoGuard guard;
  
  ErrnoGuard::ErrnoGuard(&local_10);
  std::ifstream::ifstream(local_218,"/proc/self/status",8);
  std::__cxx11::string::string(local_248);
  do {
    piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>(local_218,local_248);
    bVar1 = std::ios::operator_cast_to_bool((ios *)(piVar3 + *(long *)(*(long *)piVar3 + -0x18)));
    if (!bVar1) {
      local_24c = 2;
      goto LAB_0012223d;
    }
    iVar2 = std::__cxx11::string::compare((ulong)local_248,0,(char *)0xb);
  } while (iVar2 != 0);
  uVar4 = std::__cxx11::string::length();
  local_261 = false;
  if (0xb < uVar4) {
    pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_248);
    local_261 = *pcVar5 != '0';
  }
  local_9 = local_261;
  local_24c = 1;
LAB_0012223d:
  std::__cxx11::string::~string(local_248);
  if (local_24c == 2) {
    local_9 = false;
  }
  std::ifstream::~ifstream(local_218);
  ErrnoGuard::~ErrnoGuard(&local_10);
  return (bool)(local_9 & 1);
}

Assistant:

bool isDebuggerActive(){
            // Libstdc++ has a bug, where std::ifstream sets errno to 0
            // This way our users can properly assert over errno values
            ErrnoGuard guard;
            std::ifstream in("/proc/self/status");
            for( std::string line; std::getline(in, line); ) {
                static const int PREFIX_LEN = 11;
                if( line.compare(0, PREFIX_LEN, "TracerPid:\t") == 0 ) {
                    // We're traced if the PID is not 0 and no other PID starts
                    // with 0 digit, so it's enough to check for just a single
                    // character.
                    return line.length() > PREFIX_LEN && line[PREFIX_LEN] != '0';
                }
            }

            return false;
        }